

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O3

uint32_t __thiscall
icu_63::CollationBuilder::getWeight16Before
          (CollationBuilder *this,int32_t index,int64_t node,int32_t level)

{
  uint uVar1;
  uint32_t uVar2;
  int32_t iVar3;
  uint *puVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t *puVar7;
  CollationRootElements *this_00;
  uint32_t s;
  
  uVar6 = (uint)node & 3;
  uVar2 = 0x500;
  if (uVar6 == 2) {
    uVar2 = (uint)(ushort)((ulong)node >> 0x30);
  }
  if (1 < uVar6) {
    do {
      uVar6 = (uint)((ulong)node >> 0x1c);
      if ((this->nodes).count <= (int)(uVar6 & 0xfffff)) {
        s = 0x500;
        goto LAB_00225ca8;
      }
      node = (this->nodes).elements[uVar6 & 0xfffff];
      uVar6 = (uint)node & 3;
    } while (1 < uVar6);
  }
  if ((node & 8U) == 0) {
    s = 0x500;
    if (uVar6 != 0) {
      s = (uint32_t)(ushort)((ulong)node >> 0x30);
    }
    if ((node & 3U) != 0) {
      do {
        uVar6 = (uint)((ulong)node >> 0x1c);
        if ((this->nodes).count <= (int)(uVar6 & 0xfffff)) goto LAB_00225ca8;
        node = (this->nodes).elements[uVar6 & 0xfffff];
      } while ((node & 3U) != 0);
    }
    if ((node & 8U) == 0) goto LAB_00225caa;
  }
  return 0x100;
LAB_00225ca8:
  node = 0;
LAB_00225caa:
  this_00 = &this->rootElements;
  uVar5 = (uint32_t)((ulong)node >> 0x20);
  if (level != 1) {
    uVar2 = CollationRootElements::getTertiaryBefore(this_00,uVar5,s,uVar2);
    return uVar2;
  }
  if (uVar5 == 0) {
    puVar7 = this_00->elements;
    uVar2 = puVar7[1];
    uVar6 = puVar7[(int)uVar2];
    uVar5 = 0;
  }
  else {
    iVar3 = CollationRootElements::findP(this_00,uVar5);
    puVar7 = this_00->elements;
    uVar2 = iVar3 + 1;
    uVar1 = puVar7[(long)iVar3 + 1];
    uVar6 = uVar1;
    if (0x50004ff < uVar1) {
      uVar6 = 0x5000500;
    }
    if (-1 < (char)uVar1) {
      uVar6 = 0x5000500;
    }
    uVar5 = 0x100;
  }
  if (uVar6 >> 0x10 < s) {
    puVar4 = puVar7 + (int)uVar2;
    uVar6 = uVar6 >> 0x10;
    do {
      uVar5 = uVar6;
      uVar1 = *puVar4;
      puVar4 = puVar4 + 1;
      uVar6 = uVar1 >> 0x10;
    } while (uVar1 >> 0x10 < s);
  }
  return uVar5;
}

Assistant:

uint32_t
CollationBuilder::getWeight16Before(int32_t index, int64_t node, int32_t level) {
    U_ASSERT(strengthFromNode(node) < level || !isTailoredNode(node));
    // Collect the root CE weights if this node is for a root CE.
    // If it is not, then return the low non-primary boundary for a tailored CE.
    uint32_t t;
    if(strengthFromNode(node) == UCOL_TERTIARY) {
        t = weight16FromNode(node);
    } else {
        t = Collation::COMMON_WEIGHT16;  // Stronger node with implied common weight.
    }
    while(strengthFromNode(node) > UCOL_SECONDARY) {
        index = previousIndexFromNode(node);
        node = nodes.elementAti(index);
    }
    if(isTailoredNode(node)) {
        return Collation::BEFORE_WEIGHT16;
    }
    uint32_t s;
    if(strengthFromNode(node) == UCOL_SECONDARY) {
        s = weight16FromNode(node);
    } else {
        s = Collation::COMMON_WEIGHT16;  // Stronger node with implied common weight.
    }
    while(strengthFromNode(node) > UCOL_PRIMARY) {
        index = previousIndexFromNode(node);
        node = nodes.elementAti(index);
    }
    if(isTailoredNode(node)) {
        return Collation::BEFORE_WEIGHT16;
    }
    // [p, s, t] is a root CE. Return the preceding weight for the requested level.
    uint32_t p = weight32FromNode(node);
    uint32_t weight16;
    if(level == UCOL_SECONDARY) {
        weight16 = rootElements.getSecondaryBefore(p, s);
    } else {
        weight16 = rootElements.getTertiaryBefore(p, s, t);
        U_ASSERT((weight16 & ~Collation::ONLY_TERTIARY_MASK) == 0);
    }
    return weight16;
}